

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::
ElementsAreMatcherImpl<std::vector<prometheus::ClientMetric::Label,std::allocator<prometheus::ClientMetric::Label>>const&>
::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<prometheus::ClientMetric::Label_const&>*,std::vector<testing::Matcher<prometheus::ClientMetric::Label_const&>,std::allocator<testing::Matcher<prometheus::ClientMetric::Label_const&>>>>>
          (ElementsAreMatcherImpl<std::vector<prometheus::ClientMetric::Label,std::allocator<prometheus::ClientMetric::Label>>const&>
           *this,__normal_iterator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_*,_std::vector<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>_>
                 first,
          __normal_iterator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_*,_std::vector<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>_>
          last)

{
  MatcherBase<const_prometheus::ClientMetric::Label_&> MStack_38;
  
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_001a1420;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    Matcher<const_prometheus::ClientMetric::Label_&>::Matcher
              ((Matcher<const_prometheus::ClientMetric::Label_&> *)&MStack_38,first._M_current);
    std::
    vector<testing::Matcher<prometheus::ClientMetric::Label_const&>,std::allocator<testing::Matcher<prometheus::ClientMetric::Label_const&>>>
    ::emplace_back<testing::Matcher<prometheus::ClientMetric::Label_const&>>
              ((vector<testing::Matcher<prometheus::ClientMetric::Label_const&>,std::allocator<testing::Matcher<prometheus::ClientMetric::Label_const&>>>
                *)(this + 8),(Matcher<const_prometheus::ClientMetric::Label_&> *)&MStack_38);
    MatcherBase<const_prometheus::ClientMetric::Label_&>::~MatcherBase(&MStack_38);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }